

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O2

ostream * operator<<(ostream *os,flexfloat<(unsigned_char)__x04_,_(unsigned_char)__x05_> *obj)

{
  long lVar1;
  int __ix;
  uint uVar2;
  long *plVar3;
  int_fast16_t exp;
  ostream *poVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  _Base_bitset<1UL> _Var7;
  bitset<4UL> local_30;
  uint_t uVar4;
  
  lVar1 = *(long *)(*(long *)os + -0x18);
  __ix = get_manipulator_id();
  plVar3 = std::ios_base::iword((ios_base *)(os + lVar1),__ix);
  if (*plVar3 == 0) {
    std::ostream::_M_insert<double>((obj->v).value);
  }
  else {
    exp = flexfloat_exp(&obj->v);
    if (exp < 1) {
      uVar4 = flexfloat_denorm_frac(&obj->v,exp);
      uVar2 = (uint)uVar4;
      _Var7._M_w = 0;
    }
    else {
      uVar4 = flexfloat_frac(&obj->v);
      uVar2 = (uint)uVar4;
      _Var7._M_w = (_WordT)((uint)exp & 0xf);
    }
    poVar5 = std::ostream::_M_insert<bool>(SUB81(os,0));
    std::operator<<(poVar5,"-");
    local_30.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)_Var7._M_w;
    pbVar6 = std::operator<<(os,&local_30);
    std::operator<<(pbVar6,"-");
    local_30.super__Base_bitset<1UL>._M_w._0_4_ = uVar2 & 0x1f;
    local_30.super__Base_bitset<1UL>._M_w._4_4_ = 0;
    std::operator<<(os,(bitset<5UL> *)&local_30);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const flexfloat& obj)
    {
        if(os.iword(get_manipulator_id()) == 0)
        {
            #ifndef FLEXFLOAT_ON_QUAD
            os << fp_t(obj);
            #endif
        }
        else
        {
            int_fast16_t exp = flexfloat_exp(&(obj.v));
            uint_t frac;
            if (exp <= 0) {
                frac = flexfloat_denorm_frac(&(obj.v), exp);
                exp = 0;
            }
            else
                frac = flexfloat_frac(&(obj.v));

            os << flexfloat_sign(&(obj.v)) << "-";
            os << std::bitset<exp_bits>(exp) << "-";
            os << std::bitset<frac_bits>(frac);
        }
        return os;
    }